

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(VulkanMemoryManager *this)

{
  __node_base *p_Var1;
  unsigned_long PeakHostVisiblePages;
  unsigned_long PeakDeviceLocalPages;
  string _msg;
  char *local_a0;
  char *local_98;
  ulong local_90;
  char local_88 [8];
  ulong local_80;
  unsigned_long local_78;
  char local_70 [8];
  ulong local_68;
  ulong local_60;
  char local_58 [8];
  ulong local_50;
  unsigned_long local_48;
  char local_40 [8];
  ulong local_38;
  
  this->_vptr_VulkanMemoryManager = (_func_int **)&PTR_OnNewPageCreated_00a50698;
  local_60 = (this->m_PeakAllocatedSize)._M_elems[0];
  PeakDeviceLocalPages = local_60 / this->m_DeviceLocalPageSize;
  local_90 = (this->m_PeakAllocatedSize)._M_elems[1];
  PeakHostVisiblePages = local_90 / this->m_HostVisiblePageSize;
  local_48 = (this->m_PeakUsedSize)._M_elems[0];
  local_88[0] = '\x02';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_a0 = " pages)";
  local_98 = " pages)";
  if (PeakDeviceLocalPages == 1) {
    local_98 = " page)";
  }
  local_78 = (this->m_PeakUsedSize)._M_elems[1];
  if (PeakHostVisiblePages == 1) {
    local_a0 = " page)";
  }
  local_80 = local_90;
  local_70._0_4_ = local_88._0_4_;
  local_68 = local_90;
  local_58._0_4_ = local_88._0_4_;
  local_50 = local_60;
  local_40._0_4_ = local_88._0_4_;
  local_38 = local_60;
  Diligent::
  FormatString<char[22],std::__cxx11::string,char[79],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*,char[71],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\' stats:\n                       Peak used/allocated device-local memory size: ",
             (char (*) [79])&local_48,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_60,(MemorySizeFormatter<unsigned_long> *)0x6fe2e6,
             (char (*) [3])&PeakDeviceLocalPages,(unsigned_long *)&local_98,
             (char **)"\n                       Peak used/allocated host-visible memory size: ",
             (char (*) [71])&local_78,(MemorySizeFormatter<unsigned_long> *)" / ",
             (char (*) [4])&local_90,(MemorySizeFormatter<unsigned_long> *)0x6fe2e6,
             (char (*) [3])&PeakHostVisiblePages,(unsigned_long *)&local_a0,(char **)0x2);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  p_Var1 = &(this->m_Pages)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (p_Var1[0x1c]._M_nxt != p_Var1[0x1b]._M_nxt) {
      Diligent::FormatString<char[42]>
                (&_msg,(char (*) [42])"The page contains outstanding allocations");
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"~VulkanMemoryManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,0x105);
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  if (((this->m_CurrUsedSize)._M_elems[0].super___atomic_base<long>._M_i != 0) ||
     ((this->m_CurrUsedSize)._M_elems[1].super___atomic_base<long>._M_i != 0)) {
    Diligent::FormatString<char[39]>(&_msg,(char (*) [39])"Not all allocations have been released");
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"~VulkanMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x106);
    std::__cxx11::string::~string((string *)&_msg);
  }
  std::
  _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&(this->m_Pages)._M_h);
  std::__cxx11::string::~string((string *)&this->m_MgrName);
  return;
}

Assistant:

VulkanMemoryManager::~VulkanMemoryManager()
{
    auto PeakDeviceLocalPages = m_PeakAllocatedSize[0] / m_DeviceLocalPageSize;
    auto PeakHostVisiblePages = m_PeakAllocatedSize[1] / m_HostVisiblePageSize;
    LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "' stats:\n"
                                                         "                       Peak used/allocated device-local memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[0], 2, m_PeakAllocatedSize[0]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[0], 2, m_PeakAllocatedSize[0]),
                     " (", PeakDeviceLocalPages, (PeakDeviceLocalPages == 1 ? " page)" : " pages)"),
                     "\n                       Peak used/allocated host-visible memory size: ",
                     Diligent::FormatMemorySize(m_PeakUsedSize[1], 2, m_PeakAllocatedSize[1]), " / ",
                     Diligent::FormatMemorySize(m_PeakAllocatedSize[1], 2, m_PeakAllocatedSize[1]),
                     " (", PeakHostVisiblePages, (PeakHostVisiblePages == 1 ? " page)" : " pages)"));

    for (auto it = m_Pages.begin(); it != m_Pages.end(); ++it)
        VERIFY(it->second.IsEmpty(), "The page contains outstanding allocations");
    VERIFY(m_CurrUsedSize[0] == 0 && m_CurrUsedSize[1] == 0, "Not all allocations have been released");
}